

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationCase::iterate(BlendEquationCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  int local_368;
  int local_364;
  int ndx_17;
  int ndx_16;
  int ndx_15;
  allocator<char> local_331;
  string local_330;
  ScopedLogSection local_310;
  ScopedLogSection section_6;
  int ndx_14;
  int ndx_13;
  int ndx_12;
  allocator<char> local_2d1;
  string local_2d0;
  ScopedLogSection local_2b0;
  ScopedLogSection section_5;
  int ndx_11;
  int ndx_10;
  int ndx_9;
  allocator<char> local_271;
  string local_270;
  ScopedLogSection local_250;
  ScopedLogSection section_4;
  int ndx_8;
  int ndx_7;
  int ndx_6;
  allocator<char> local_211;
  string local_210;
  ScopedLogSection local_1f0;
  ScopedLogSection section_3;
  int local_1e0;
  int ndx_5;
  int ndx_4;
  allocator<char> local_1b1;
  string local_1b0;
  ScopedLogSection local_190;
  ScopedLogSection section_2;
  int local_180;
  int ndx_3;
  int ndx_2;
  allocator<char> local_151;
  string local_150;
  ScopedLogSection local_130;
  ScopedLogSection section_1;
  int local_120;
  int ndx_1;
  int ndx;
  allocator<char> local_f1;
  string local_f0;
  ScopedLogSection local_d0;
  ScopedLogSection section;
  deInt32 maxDrawBuffers;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  ResultCollector result;
  CallLogWrapper gl;
  deUint32 blendEquations [5];
  BlendEquationCase *this_local;
  
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0," // ERROR: ",&local_b1);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_90,pTVar3,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  section.m_log._0_4_ = 0;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8824,(GLint *)&section);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x4de);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Initial",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Initial value",(allocator<char> *)((long)&ndx_1 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_f0,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_1 + 3));
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  for (local_120 = 0; local_120 < (int)section.m_log; local_120 = local_120 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_120,0x8006,this->m_verifierType);
  }
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < (int)section.m_log;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,section_1.m_log._4_4_,0x8006,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_d0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"AfterSettingCommon",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_2,"After setting common",(allocator<char> *)((long)&ndx_3 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_130,pTVar3,&local_150,(string *)&ndx_2);
  std::__cxx11::string::~string((string *)&ndx_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_3 + 3));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  glu::CallLogWrapper::glBlendEquation
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x800a);
  for (local_180 = 0; local_180 < (int)section.m_log; local_180 = local_180 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_180,0x800a,this->m_verifierType);
  }
  for (section_2.m_log._4_4_ = 0; section_2.m_log._4_4_ < (int)section.m_log;
      section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,section_2.m_log._4_4_,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_130);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"AfterSettingCommonSeparate",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_4,"After setting common separate",(allocator<char> *)((long)&ndx_5 + 3))
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_190,pTVar3,&local_1b0,(string *)&ndx_4);
  std::__cxx11::string::~string((string *)&ndx_4);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_5 + 3));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  glu::CallLogWrapper::glBlendEquationSeparate
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x800b,0x800a);
  for (local_1e0 = 0; local_1e0 < (int)section.m_log; local_1e0 = local_1e0 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_1e0,0x800b,this->m_verifierType);
  }
  for (section_3.m_log._4_4_ = 0; section_3.m_log._4_4_ < (int)section.m_log;
      section_3.m_log._4_4_ = section_3.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,section_3.m_log._4_4_,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_190);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"AfterSettingIndexed",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_6,"After setting indexed",(allocator<char> *)((long)&ndx_7 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_1f0,pTVar3,&local_210,(string *)&ndx_6);
  std::__cxx11::string::~string((string *)&ndx_6);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_7 + 3));
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  for (ndx_8 = 0; ndx_8 < (int)section.m_log; ndx_8 = ndx_8 + 1) {
    glu::CallLogWrapper::glBlendEquationi
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_8,
               blendEquations[(long)(ndx_8 % 5) + -2]);
  }
  for (section_4.m_log._4_4_ = 0; section_4.m_log._4_4_ < (int)section.m_log;
      section_4.m_log._4_4_ = section_4.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,section_4.m_log._4_4_,blendEquations[(long)(section_4.m_log._4_4_ % 5) + -2],
               this->m_verifierType);
  }
  for (section_4.m_log._0_4_ = 0; (int)section_4.m_log < (int)section.m_log;
      section_4.m_log._0_4_ = (int)section_4.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,(int)section_4.m_log,blendEquations[(long)((int)section_4.m_log % 5) + -2],
               this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1f0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"AfterSettingIndexedSeparate",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_9,"After setting indexed separate",
             (allocator<char> *)((long)&ndx_10 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_250,pTVar3,&local_270,(string *)&ndx_9);
  std::__cxx11::string::~string((string *)&ndx_9);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_10 + 3));
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  for (ndx_11 = 0; ndx_11 < (int)section.m_log; ndx_11 = ndx_11 + 1) {
    glu::CallLogWrapper::glBlendEquationSeparatei
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_11,
               blendEquations[(long)(ndx_11 % 5) + -2],
               blendEquations[(long)(ndx_11 + 1 + ((ndx_11 + 1) / 5) * -5) + -2]);
  }
  for (section_5.m_log._4_4_ = 0; section_5.m_log._4_4_ < (int)section.m_log;
      section_5.m_log._4_4_ = section_5.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,section_5.m_log._4_4_,blendEquations[(long)(section_5.m_log._4_4_ % 5) + -2],
               this->m_verifierType);
  }
  for (section_5.m_log._0_4_ = 0; (int)section_5.m_log < (int)section.m_log;
      section_5.m_log._0_4_ = (int)section_5.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,(int)section_5.m_log,
               blendEquations
               [(long)((int)section_5.m_log + 1 + (((int)section_5.m_log + 1) / 5) * -5) + -2],
               this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_250);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"AfterResettingIndexedWithCommon",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_12,"After resetting indexed with common",
             (allocator<char> *)((long)&ndx_13 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_2b0,pTVar3,&local_2d0,(string *)&ndx_12);
  std::__cxx11::string::~string((string *)&ndx_12);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_13 + 3));
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  for (ndx_14 = 0; ndx_14 < (int)section.m_log; ndx_14 = ndx_14 + 1) {
    glu::CallLogWrapper::glBlendEquationi
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_14,
               blendEquations[(long)(ndx_14 % 5) + -2]);
  }
  glu::CallLogWrapper::glBlendEquation
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x800a);
  for (section_6.m_log._4_4_ = 0; section_6.m_log._4_4_ < (int)section.m_log;
      section_6.m_log._4_4_ = section_6.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,section_6.m_log._4_4_,0x800a,this->m_verifierType);
  }
  for (section_6.m_log._0_4_ = 0; (int)section_6.m_log < (int)section.m_log;
      section_6.m_log._0_4_ = (int)section_6.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,(int)section_6.m_log,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_2b0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"AfterResettingIndexedWithCommonSeparate",&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_15,"After resetting indexed with common separate",
             (allocator<char> *)((long)&ndx_16 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_310,pTVar3,&local_330,(string *)&ndx_15);
  std::__cxx11::string::~string((string *)&ndx_15);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_16 + 3));
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  for (ndx_17 = 0; ndx_17 < (int)section.m_log; ndx_17 = ndx_17 + 1) {
    glu::CallLogWrapper::glBlendEquationSeparatei
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_17,
               blendEquations[(long)(ndx_17 % 5) + -2],
               blendEquations[(long)(ndx_17 + 1 + ((ndx_17 + 1) / 5) * -5) + -2]);
  }
  glu::CallLogWrapper::glBlendEquationSeparate
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x800b,0x800a);
  for (local_364 = 0; local_364 < (int)section.m_log; local_364 = local_364 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_364,0x800b,this->m_verifierType);
  }
  for (local_368 = 0; local_368 < (int)section.m_log; local_368 = local_368 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_90,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,local_368,0x800a,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_310);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_90,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_90);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

BlendEquationCase::IterateResult BlendEquationCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_ADD, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_ADD, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquationSeparate(GL_FUNC_REVERSE_SUBTRACT, GL_FUNC_SUBTRACT);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_FUNC_REVERSE_SUBTRACT, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_FUNC_SUBTRACT, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}